

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetInteger64Verifier::verifyFloat4Color
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1,GLfloat reference2,GLfloat reference3)

{
  bool bVar1;
  qpTestResult qVar2;
  GLint64 GVar3;
  GLint64 GVar4;
  GLint64 GVar5;
  GLint64 GVar6;
  GLint64 GVar7;
  GLint64 GVar8;
  GLint64 GVar9;
  long (*palVar10) [4];
  TestLog *this_00;
  MessageBuilder *pMVar11;
  Hex<16UL> local_2c8;
  Hex<16UL> local_2c0;
  Hex<16UL> local_2b8;
  Hex<16UL> local_2b0;
  Hex<16UL> local_2a8;
  Hex<16UL> local_2a0;
  Hex<16UL> local_298;
  Hex<16UL> local_290;
  Hex<16UL> local_288;
  Hex<16UL> local_280;
  Hex<16UL> local_278;
  Hex<16UL> local_270 [3];
  MessageBuilder local_258;
  undefined1 local_d8 [8];
  StateQueryMemoryWriteGuard<long[4]> floatVector4;
  GLint64 referenceAsGLintMax [4];
  GLint64 referenceAsGLintMin [4];
  GLfloat reference3_local;
  GLfloat reference2_local;
  GLfloat reference1_local;
  GLfloat reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  GVar3 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference0);
  GVar4 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference1);
  GVar5 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference2);
  GVar6 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference3);
  GVar7 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference0);
  floatVector4.m_postguard[3] = GVar7 + 0x7ff;
  GVar7 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference1);
  GVar8 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference2);
  GVar9 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference3);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long[4]> *)local_d8);
  palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
             operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,*palVar10);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long[4]> *)local_d8,testCtx);
  if ((bVar1) &&
     (((((palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                     operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8),
         (*palVar10)[0] < GVar3 + -0x7ff ||
         (palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                     operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8),
         floatVector4.m_postguard[3] < (*palVar10)[0])) ||
        (palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8),
        (*palVar10)[1] < GVar4 + -0x7ff)) ||
       ((palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8),
        GVar7 + 0x7ff < (*palVar10)[1] ||
        (palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8),
        (*palVar10)[2] < GVar5 + -0x7ff)))) ||
      ((palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8),
       GVar8 + 0x7ff < (*palVar10)[2] ||
       ((palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8),
        (*palVar10)[3] < GVar6 + -0x7ff ||
        (palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8),
        GVar9 + 0x7ff < (*palVar10)[3])))))))) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_258,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_258,(char (*) [30])"// ERROR: expected in ranges ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c3fdfc);
    local_270[0] = tcu::toHex<long>(GVar3 + -0x7ff);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,local_270);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c7b4d6);
    local_278 = tcu::toHex<long>(floatVector4.m_postguard[3]);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_278);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [4])0x2b7b6d0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c3fdfc);
    local_280 = tcu::toHex<long>(GVar4 + -0x7ff);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_280);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c7b4d6);
    local_288 = tcu::toHex<long>(GVar7 + 0x7ff);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_288);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [4])0x2b7b6d0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c3fdfc);
    local_290 = tcu::toHex<long>(GVar5 + -0x7ff);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_290);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c7b4d6);
    local_298 = tcu::toHex<long>(GVar8 + 0x7ff);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_298);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [4])0x2b7b6d0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c3fdfc);
    local_2a0 = tcu::toHex<long>(GVar6 + -0x7ff);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2a0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c7b4d6);
    local_2a8 = tcu::toHex<long>(GVar9 + 0x7ff);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2a8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x29ea7ce);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [7])0x2b8b5f6);
    palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8);
    local_2b0 = tcu::toHex<long>((*palVar10)[0]);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2b0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
    palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8);
    local_2b8 = tcu::toHex<long>((*palVar10)[1]);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2b8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
    palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8);
    local_2c0 = tcu::toHex<long>((*palVar10)[2]);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2c0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
    palVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_d8);
    local_2c8 = tcu::toHex<long>((*palVar10)[3]);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2c8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c7b4d6);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_258);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyFloat4Color (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1, GLfloat reference2, GLfloat reference3)
{
	using tcu::TestLog;
	using tcu::toHex;

	const GLint64 referenceAsGLintMin[] =
	{
		expandGLFloatToInteger(reference0) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference2) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference3) - FLOAT_EXPANSION_E_64
	};
	const GLint64 referenceAsGLintMax[] =
	{
		expandGLFloatToInteger(reference0) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference2) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference3) + FLOAT_EXPANSION_E_64
	};

	StateQueryMemoryWriteGuard<GLint64[4]> floatVector4;
	glGetInteger64v(name, floatVector4);

	if (!floatVector4.verifyValidity(testCtx))
		return;

	if (floatVector4[0] < referenceAsGLintMin[0] || floatVector4[0] > referenceAsGLintMax[0] ||
		floatVector4[1] < referenceAsGLintMin[1] || floatVector4[1] > referenceAsGLintMax[1] ||
		floatVector4[2] < referenceAsGLintMin[2] || floatVector4[2] > referenceAsGLintMax[2] ||
		floatVector4[3] < referenceAsGLintMin[3] || floatVector4[3] > referenceAsGLintMax[3])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected in ranges "
			<< "[" << toHex(referenceAsGLintMin[0]) << " " << toHex(referenceAsGLintMax[0]) << "], "
			<< "[" << toHex(referenceAsGLintMin[1]) << " " << toHex(referenceAsGLintMax[1]) << "], "
			<< "[" << toHex(referenceAsGLintMin[2]) << " " << toHex(referenceAsGLintMax[2]) << "], "
			<< "[" << toHex(referenceAsGLintMin[3]) << " " << toHex(referenceAsGLintMax[3]) << "]"
			<< "; got "
			<< toHex(floatVector4[0]) << ", "
			<< toHex(floatVector4[1]) << ", "
			<< toHex(floatVector4[2]) << ", "
			<< toHex(floatVector4[3]) << " "<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}